

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateI32Arr
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag)

{
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  ostringstream local_248 [8];
  ostringstream ss;
  undefined1 local_c8 [4];
  uint32_t bit_width;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  uint32_t local_84;
  undefined1 local_80 [4];
  uint32_t component_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Instruction *local_40;
  Instruction *type_inst;
  spv_result_t error;
  uint32_t underlying_type;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *diag_local;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  type_inst._4_4_ = 0;
  _error = diag;
  diag_local = (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  type_inst._0_4_ = GetUnderlyingType(this->_,decoration,inst,(uint32_t *)((long)&type_inst + 4));
  this_local._4_4_ = (spv_result_t)type_inst;
  if ((spv_result_t)type_inst == SPV_SUCCESS) {
    local_40 = ValidationState_t::FindDef(this->_,type_inst._4_4_);
    OVar3 = Instruction::opcode(local_40);
    pfVar1 = _error;
    if (OVar3 == OpTypeArray) {
      local_84 = Instruction::word(local_40,2);
      bVar2 = ValidationState_t::IsIntScalarType(this->_,local_84);
      pfVar1 = _error;
      if (bVar2) {
        uVar4 = ValidationState_t::GetBitWidth(this->_,local_84);
        if (uVar4 == 0x20) {
          this_local._4_4_ = SPV_SUCCESS;
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_248);
          (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                    (&local_268,this,(Decoration *)inst_local,(Instruction *)diag_local);
          poVar5 = std::operator<<((ostream *)local_248,(string *)&local_268);
          poVar5 = std::operator<<(poVar5," has components with bit width ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
          std::operator<<(poVar5,".");
          std::__cxx11::string::~string((string *)&local_268);
          pfVar1 = _error;
          std::__cxx11::ostringstream::str();
          this_local._4_4_ =
               std::
               function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               ::operator()(pfVar1,&local_288);
          std::__cxx11::string::~string((string *)&local_288);
          std::__cxx11::ostringstream::~ostringstream(local_248);
        }
      }
      else {
        (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                  ((string *)local_c8,this,(Decoration *)inst_local,(Instruction *)diag_local);
        std::operator+(&local_a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ," components are not int scalar.");
        this_local._4_4_ =
             std::
             function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::operator()(pfVar1,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)local_c8);
      }
    }
    else {
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                ((string *)local_80,this,(Decoration *)inst_local,(Instruction *)diag_local);
      std::operator+(&local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     " is not an array.");
      this_local._4_4_ =
           std::
           function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::operator()(pfVar1,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)local_80);
    }
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateI32Arr(
    const Decoration& decoration, const Instruction& inst,
    const std::function<spv_result_t(const std::string& message)>& diag) {
  uint32_t underlying_type = 0;
  if (spv_result_t error =
          GetUnderlyingType(_, decoration, inst, &underlying_type)) {
    return error;
  }

  const Instruction* const type_inst = _.FindDef(underlying_type);
  if (type_inst->opcode() != spv::Op::OpTypeArray) {
    return diag(GetDefinitionDesc(decoration, inst) + " is not an array.");
  }

  const uint32_t component_type = type_inst->word(2);
  if (!_.IsIntScalarType(component_type)) {
    return diag(GetDefinitionDesc(decoration, inst) +
                " components are not int scalar.");
  }

  const uint32_t bit_width = _.GetBitWidth(component_type);
  if (bit_width != 32) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst)
       << " has components with bit width " << bit_width << ".";
    return diag(ss.str());
  }

  return SPV_SUCCESS;
}